

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void gc(Vm *vm)

{
  CallFrame *pCVar1;
  CrispyValue *pCVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  Vm *pVVar6;
  size_t sVar7;
  ulong uVar8;
  Object *object;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar9;
  long lVar10;
  ulong uVar11;
  Object **ppOVar12;
  
  uVar4 = vm->frame_count - 1;
  if (-1 < (int)uVar4) {
    uVar11 = (ulong)uVar4;
    do {
      pCVar1 = (vm->frames).frame_pointers[uVar11];
      uVar5 = (pCVar1->variables).count;
      if (uVar5 != 0) {
        lVar10 = 8;
        uVar8 = 0;
        do {
          pCVar2 = (pCVar1->variables).values;
          if (*(int *)((long)pCVar2 + lVar10 + -8) == 2) {
            mark(*(Object **)((long)&pCVar2->type + lVar10));
            uVar5 = (pCVar1->variables).count;
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x10;
        } while (uVar8 < uVar5);
      }
      uVar5 = (pCVar1->constants).count;
      if (uVar5 != 0) {
        lVar10 = 8;
        uVar8 = 0;
        do {
          pCVar2 = (pCVar1->constants).values;
          if (*(int *)((long)pCVar2 + lVar10 + -8) == 2) {
            mark(*(Object **)((long)&pCVar2->type + lVar10));
            uVar5 = (pCVar1->constants).count;
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x10;
        } while (uVar8 < uVar5);
      }
      pVVar6 = (Vm *)vm->sp;
      if (pVVar6 != vm && -1 < (long)pVVar6 - (long)vm) {
        lVar10 = 0;
        paVar9 = &vm->stack[0].field_1;
        do {
          if (((CrispyValue *)(paVar9 + -1))->type == OBJECT) {
            mark(paVar9->o_value);
            pVVar6 = (Vm *)vm->sp;
          }
          lVar10 = lVar10 + 1;
          paVar9 = paVar9 + 2;
        } while (lVar10 < (long)pVVar6 - (long)vm >> 4);
      }
      bVar3 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar3);
  }
  object = vm->first_object;
  if (object != (Object *)0x0) {
    ppOVar12 = &vm->first_object;
    do {
      if (object->marked == '\0') {
        *ppOVar12 = object->next;
        sVar7 = free_object(object);
        vm->allocated_mem = vm->allocated_mem - sVar7;
      }
      else {
        object->marked = '\0';
        ppOVar12 = &object->next;
      }
      object = *ppOVar12;
    } while (object != (Object *)0x0);
  }
  vm->max_alloc_mem = vm->allocated_mem * 2;
  return;
}

Assistant:

void gc(Vm *vm) {
#if DEBUG_TRACE_GC
    size_t mem_before = vm->allocated_mem;
#endif

#if DISABLE_GC
    return;
#endif

    mark_all(vm);
    sweep(vm);

    vm->max_alloc_mem = vm->allocated_mem * 2;

#if DEBUG_TRACE_GC
    printf("Collected %ld bytes, %ld remaining.\n", mem_before - vm->allocated_mem, vm->allocated_mem);
#endif
}